

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::HairBxDF::f(HairBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  ulong uVar1;
  ulong uVar2;
  Vector3f w;
  Vector3f w_00;
  undefined8 in_RDI;
  array<float,_4> *paVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Float FVar7;
  double dVar8;
  double dVar9;
  ulong extraout_XMM0_Qb;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar17 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  uint in_XMM1_Da;
  undefined1 auVar25 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 in_ZMM2 [64];
  uint in_XMM3_Da;
  SampledSpectrum SVar26;
  Float cosThetap_o;
  Float sinThetap_o;
  int p;
  array<pbrt::SampledSpectrum,_4> ap;
  Float phi;
  SampledSpectrum T;
  Float gamma_t;
  Float cosGamma_t;
  Float sinGamma_t;
  Float etap;
  Float cosTheta_t;
  Float sinTheta_t;
  Float phi_i;
  Float cosTheta_i;
  Float sinTheta_i;
  Float gamma_o;
  Float phi_o;
  Float cosTheta_o;
  Float sinTheta_o;
  SampledSpectrum fsum;
  undefined4 in_stack_fffffffffffffe48;
  Float in_stack_fffffffffffffe4c;
  Float FVar27;
  Float gamma_o_00;
  Float a;
  int in_stack_fffffffffffffe60;
  Float in_stack_fffffffffffffe64;
  Float in_stack_fffffffffffffe68;
  Float in_stack_fffffffffffffe6c;
  undefined8 in_stack_fffffffffffffe70;
  int local_11c;
  Float in_stack_ffffffffffffff2c;
  Float in_stack_ffffffffffffff30;
  Float in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff38;
  undefined8 uVar28;
  float local_40;
  float local_20;
  array<float,_4> local_10;
  undefined1 auVar10 [64];
  undefined1 auVar18 [64];
  
  uVar1 = vmovlpd_avx(in_ZMM0._0_16_);
  uVar2 = vmovlpd_avx(in_ZMM2._0_16_);
  gamma_o_00 = (Float)in_RDI;
  a = (Float)((ulong)in_RDI >> 0x20);
  local_20 = (float)uVar1;
  Sqr<float>(local_20);
  FVar27 = 1.0;
  fVar4 = SafeSqrt(0.0);
  dVar8 = std::atan2((double)(ulong)in_XMM1_Da,(double)(uVar1 >> 0x20));
  SafeASin(0.0);
  local_40 = (float)uVar2;
  Sqr<float>(local_40);
  SafeSqrt(0.0);
  dVar9 = std::atan2((double)(ulong)in_XMM3_Da,(double)(uVar2 >> 0x20));
  Sqr<float>(local_20 / *(float *)(CONCAT44(a,gamma_o_00) + 4));
  SafeSqrt(0.0);
  fVar5 = Sqr<float>(*(float *)(CONCAT44(a,gamma_o_00) + 4));
  Sqr<float>(local_20);
  fVar6 = SafeSqrt(0.0);
  Sqr<float>(*(float *)CONCAT44(a,gamma_o_00) / (fVar6 / fVar4));
  auVar25 = ZEXT856(extraout_XMM0_Qb);
  SafeSqrt(0.0);
  SafeASin(0.0);
  auVar17 = extraout_var;
  SVar26 = SampledSpectrum::operator-
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  auVar18._0_8_ = SVar26.values.values._8_8_;
  auVar18._8_56_ = auVar25;
  auVar10._0_8_ = SVar26.values.values._0_8_;
  auVar10._8_56_ = auVar17;
  uVar28 = vmovlpd_avx(auVar10._0_16_);
  vmovlpd_avx(auVar18._0_16_);
  auVar25 = (undefined1  [56])0x0;
  auVar17 = ZEXT856(0);
  SVar26 = SampledSpectrum::operator*
                     ((SampledSpectrum *)
                      CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),a);
  auVar19._0_8_ = SVar26.values.values._8_8_;
  auVar19._8_56_ = auVar25;
  auVar11._0_8_ = SVar26.values.values._0_8_;
  auVar11._8_56_ = auVar17;
  vmovlpd_avx(auVar11._0_16_);
  vmovlpd_avx(auVar19._0_16_);
  SVar26 = Exp((SampledSpectrum *)CONCAT44(FVar27,fVar5));
  auVar20._0_8_ = SVar26.values.values._8_8_;
  auVar20._8_56_ = auVar25;
  auVar12._0_8_ = SVar26.values.values._0_8_;
  auVar12._8_56_ = auVar17;
  vmovlpd_avx(auVar12._0_16_);
  vmovlpd_avx(auVar20._0_16_);
  SVar26.values.values[1] = SUB84(dVar9,0) - SUB84(dVar8,0);
  SVar26.values.values[0] = in_stack_ffffffffffffff38;
  SVar26.values.values[2] = (float)(int)uVar28;
  SVar26.values.values[3] = (float)(int)((ulong)uVar28 >> 0x20);
  Ap(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,SVar26);
  paVar3 = &local_10;
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(FVar27,fVar5),in_stack_fffffffffffffe4c);
  for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
    std::abs((int)paVar3);
    auVar25 = (undefined1  [56])0x0;
    in_stack_fffffffffffffe4c =
         Mp((Float)((ulong)in_stack_fffffffffffffe70 >> 0x20),(Float)in_stack_fffffffffffffe70,
            in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
    pstd::array<pbrt::SampledSpectrum,_4>::operator[]
              ((array<pbrt::SampledSpectrum,_4> *)&stack0xfffffffffffffefc,(long)local_11c);
    auVar17 = (undefined1  [56])0x0;
    SVar26 = pbrt::operator*(FVar27,(SampledSpectrum *)
                                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    auVar21._0_8_ = SVar26.values.values._8_8_;
    auVar21._8_56_ = auVar25;
    auVar13._0_8_ = SVar26.values.values._0_8_;
    auVar13._8_56_ = auVar17;
    vmovlpd_avx(auVar13._0_16_);
    vmovlpd_avx(auVar21._0_16_);
    auVar25 = (undefined1  [56])0x0;
    Np(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,a,gamma_o_00,FVar27);
    auVar17 = extraout_var_00;
    SVar26 = SampledSpectrum::operator*
                       ((SampledSpectrum *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),a);
    auVar22._0_8_ = SVar26.values.values._8_8_;
    auVar22._8_56_ = auVar25;
    auVar14._0_8_ = SVar26.values.values._0_8_;
    auVar14._8_56_ = auVar17;
    vmovlpd_avx(auVar14._0_16_);
    vmovlpd_avx(auVar22._0_16_);
    paVar3 = &local_10;
    SampledSpectrum::operator+=
              ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (SampledSpectrum *)CONCAT44(a,gamma_o_00));
  }
  auVar25 = (undefined1  [56])0x0;
  FVar7 = Mp((Float)((ulong)in_stack_fffffffffffffe70 >> 0x20),(Float)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
  pstd::array<pbrt::SampledSpectrum,_4>::operator[]
            ((array<pbrt::SampledSpectrum,_4> *)&stack0xfffffffffffffefc,3);
  auVar17 = (undefined1  [56])0x0;
  SVar26 = pbrt::operator*(FVar27,(SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe4c,FVar7));
  auVar23._0_8_ = SVar26.values.values._8_8_;
  auVar23._8_56_ = auVar25;
  auVar15._0_8_ = SVar26.values.values._0_8_;
  auVar15._8_56_ = auVar17;
  vmovlpd_avx(auVar15._0_16_);
  vmovlpd_avx(auVar23._0_16_);
  auVar17 = (undefined1  [56])0x0;
  SVar26 = SampledSpectrum::operator/((SampledSpectrum *)CONCAT44(a,gamma_o_00),FVar27);
  auVar24._0_8_ = SVar26.values.values._8_8_;
  auVar24._8_56_ = auVar25;
  auVar16._0_8_ = SVar26.values.values._0_8_;
  auVar16._8_56_ = auVar17;
  vmovlpd_avx(auVar16._0_16_);
  vmovlpd_avx(auVar24._0_16_);
  SampledSpectrum::operator+=
            ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (SampledSpectrum *)CONCAT44(a,gamma_o_00));
  w.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe60;
  w.super_Tuple3<pbrt::Vector3,_float>.x = a;
  w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe64;
  FVar27 = AbsCosTheta(w);
  if (0.0 < FVar27) {
    fVar4 = (float)(uVar2 >> 0x20);
    w_00.super_Tuple3<pbrt::Vector3,_float>.y = local_40;
    w_00.super_Tuple3<pbrt::Vector3,_float>.x = a;
    w_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar4;
    AbsCosTheta(w_00);
    SampledSpectrum::operator/=((SampledSpectrum *)CONCAT44(fVar4,local_40),a);
  }
  return (array<float,_4>)(array<float,_4>)local_10.values;
}

Assistant:

PBRT_CPU_GPU SampledSpectrum HairBxDF::f(Vector3f wo, Vector3f wi, TransportMode mode) const {
    // Compute hair coordinate system terms related to _wo_
    Float sinTheta_o = wo.x;
    Float cosTheta_o = SafeSqrt(1 - Sqr(sinTheta_o));
    Float phi_o = std::atan2(wo.z, wo.y);
    Float gamma_o = SafeASin(h);

    // Compute hair coordinate system terms related to _wi_
    Float sinTheta_i = wi.x;
    Float cosTheta_i = SafeSqrt(1 - Sqr(sinTheta_i));
    Float phi_i = std::atan2(wi.z, wi.y);

    // Compute $\cos\,\thetat$ for refracted ray
    Float sinTheta_t = sinTheta_o / eta;
    Float cosTheta_t = SafeSqrt(1 - Sqr(sinTheta_t));

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(Sqr(eta) - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute the transmittance _T_ of a single path through the cylinder
    SampledSpectrum T = Exp(-sigma_a * (2 * cosGamma_t / cosTheta_t));

    // Evaluate hair BSDF
    Float phi = phi_i - phi_o;
    pstd::array<SampledSpectrum, pMax + 1> ap = Ap(cosTheta_o, eta, h, T);
    SampledSpectrum fsum(0.);

    for (int p = 0; p < pMax; ++p) {
        // Compute $\sin\,\thetao$ and $\cos\,\thetao$ terms accounting for scales
        Float sinThetap_o, cosThetap_o;
        if (p == 0) {
            sinThetap_o = sinTheta_o * cos2kAlpha[1] - cosTheta_o * sin2kAlpha[1];
            cosThetap_o = cosTheta_o * cos2kAlpha[1] + sinTheta_o * sin2kAlpha[1];
        }
        // Handle remainder of $p$ values for hair scale tilt
        else if (p == 1) {
            sinThetap_o = sinTheta_o * cos2kAlpha[0] + cosTheta_o * sin2kAlpha[0];
            cosThetap_o = cosTheta_o * cos2kAlpha[0] - sinTheta_o * sin2kAlpha[0];
        } else if (p == 2) {
            sinThetap_o = sinTheta_o * cos2kAlpha[2] + cosTheta_o * sin2kAlpha[2];
            cosThetap_o = cosTheta_o * cos2kAlpha[2] - sinTheta_o * sin2kAlpha[2];
        } else {
            sinThetap_o = sinTheta_o;
            cosThetap_o = cosTheta_o;
        }

        // Handle out-of-range $\cos\,\thetao$ from scale adjustment
        cosThetap_o = std::abs(cosThetap_o);

        fsum += Mp(cosTheta_i, cosThetap_o, sinTheta_i, sinThetap_o, v[p]) * ap[p] *
                Np(phi, p, s, gamma_o, gamma_t);
    }
    // Compute contribution of remaining terms after _pMax_
    fsum +=
        Mp(cosTheta_i, cosTheta_o, sinTheta_i, sinTheta_o, v[pMax]) * ap[pMax] / (2 * Pi);

    if (AbsCosTheta(wi) > 0)
        fsum /= AbsCosTheta(wi);
    DCHECK(!IsInf(fsum.Average()) && !IsNaN(fsum.Average()));
    return fsum;
}